

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CProgram *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pCVar3;
  TypeInfo local_a8;
  CError local_70;
  TypeInfo local_40;
  CProgram *local_18;
  CProgram *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CProgram *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: program\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->mainClass);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CMainClass,_std::default_delete<CMainClass>_>::operator->
                       (&local_18->mainClass);
    (**(pCVar2->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
    TypeInfo::TypeInfo(&local_40,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
  }
  else {
    pCVar2 = std::unique_ptr<CMainClass,_std::default_delete<CMainClass>_>::operator->
                       (&local_18->mainClass);
    CError::CError(&local_70,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(pCVar2->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_70);
    CError::~CError(&local_70);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->classList);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CClassList,_std::default_delete<CClassList>_>::operator->
                       (&local_18->classList);
    (**(pCVar3->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
    TypeInfo::TypeInfo(&local_a8,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_a8);
    TypeInfo::~TypeInfo(&local_a8);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CProgram &stm )
{
    std::cout << "typechecker: program\n";
    if( stm.mainClass ) {
        stm.mainClass->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.mainClass->position ) );
    }
    if( stm.classList ) {
        stm.classList->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
}